

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  DenseIndex DVar1;
  double *pdVar2;
  double dVar3;
  Matrix<double,__1,_1,_0,__1,_1> *pMVar4;
  pointer pMVar5;
  pointer pMVar6;
  char cVar7;
  int iVar8;
  Index size;
  istream *piVar9;
  CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *pCVar10;
  ostream *poVar11;
  Index index;
  ulong uVar12;
  long lVar13;
  char *pcVar14;
  long lVar15;
  VectorXd *_other;
  float fVar16;
  Tools tools;
  float px;
  float y_gt;
  float x_gt;
  vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  estimations;
  float ro;
  longlong timestamp;
  string sensor_type;
  float vy_gt;
  float vx_gt;
  vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  ground_truth;
  vector<MeasurementPackage,_std::allocator<MeasurementPackage>_> measurement_pack_list;
  vector<GroundTruthPackage,_std::allocator<GroundTruthPackage>_> gt_pack_list;
  string line;
  string out_file_name_;
  string in_file_name_;
  ofstream out_file_;
  UKF ukf;
  ifstream in_file_;
  CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_760;
  float local_73c;
  double local_738;
  double local_730;
  float local_724;
  float local_720;
  float local_71c;
  undefined1 local_718 [8];
  pointer pMStack_710;
  Matrix<double,__1,_1,_0,__1,_1> local_708;
  double local_6f0;
  pointer local_6e8;
  undefined1 local_6e0 [24];
  long local_6c8;
  float local_6c0;
  float local_6bc;
  undefined1 local_6b8 [16];
  Matrix<double,__1,_1,_0,__1,_1> local_6a8;
  vector<MeasurementPackage,_std::allocator<MeasurementPackage>_> local_698;
  vector<GroundTruthPackage,_std::allocator<GroundTruthPackage>_> local_678;
  undefined1 local_660 [16];
  DenseStorage<double,__1,__1,_1,_0> local_650;
  long local_640;
  double local_638;
  double local_630;
  double local_628;
  double local_620;
  undefined1 *local_618;
  undefined8 local_610;
  undefined1 local_608 [16];
  string local_5f8;
  string local_5d8;
  long local_5b8;
  filebuf local_5b0 [240];
  ios_base local_4c0 [264];
  undefined1 local_3b8 [256];
  double local_2b8;
  double local_2b0;
  long local_238 [65];
  
  check_arguments(argc,argv);
  std::__cxx11::string::string((string *)&local_5d8,argv[1],(allocator *)local_238);
  std::ifstream::ifstream(local_238,local_5d8._M_dataplus._M_p,_S_in);
  std::__cxx11::string::string((string *)&local_5f8,argv[2],(allocator *)&local_5b8);
  std::ofstream::ofstream(&local_5b8,local_5f8._M_dataplus._M_p,_S_out);
  check_files((ifstream *)local_238,&local_5d8,(ofstream *)&local_5b8,&local_5f8);
  local_698.super__Vector_base<MeasurementPackage,_std::allocator<MeasurementPackage>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_698.super__Vector_base<MeasurementPackage,_std::allocator<MeasurementPackage>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_698.super__Vector_base<MeasurementPackage,_std::allocator<MeasurementPackage>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_678.super__Vector_base<GroundTruthPackage,_std::allocator<GroundTruthPackage>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_678.super__Vector_base<GroundTruthPackage,_std::allocator<GroundTruthPackage>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_678.super__Vector_base<GroundTruthPackage,_std::allocator<GroundTruthPackage>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_618 = local_608;
  local_610 = 0;
  local_608[0] = 0;
  while( true ) {
    cVar7 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) +
                            (char)(ifstream *)local_238);
    piVar9 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)local_238,(string *)&local_618,cVar7);
    if (((byte)piVar9[*(long *)(*(long *)piVar9 + -0x18) + 0x20] & 5) != 0) break;
    local_6e0._0_8_ = local_6e0 + 0x10;
    local_6e0._8_8_ = 0;
    local_6e0._16_8_ = local_6e0._16_8_ & 0xffffffffffffff00;
    local_708.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         (double *)0x0;
    local_708.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
    local_6a8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         (double *)0x0;
    local_6a8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
    std::__cxx11::istringstream::istringstream
              ((istringstream *)local_3b8,(string *)&local_618,_S_in);
    std::operator>>((istream *)local_3b8,(string *)local_6e0);
    iVar8 = std::__cxx11::string::compare((char *)local_6e0);
    if (iVar8 == 0) {
      pMStack_710 = (pointer)((ulong)pMStack_710 & 0xffffffff00000000);
      Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
                ((DenseStorage<double,__1,__1,_1,_0> *)&local_760,2,2,1);
      DVar1 = local_708.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_rows;
      pdVar2 = local_708.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
               m_data;
      pMVar4 = local_760.m_xpr;
      local_760.m_xpr =
           (Matrix<double,__1,_1,_0,__1,_1> *)
           local_708.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
      ;
      local_708.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
           (double *)pMVar4;
      local_708.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
           local_760.m_row;
      local_760.m_row = DVar1;
      free(pdVar2);
      std::istream::_M_extract<float>((float *)local_3b8);
      std::istream::_M_extract<float>((float *)local_3b8);
      local_760.m_xpr = &local_708;
      local_760.m_row = 0;
      local_760.m_col = 1;
      local_760.m_currentBlockRows = 1;
      (((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
       local_708.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data)->
      m_storage).m_data = (double *)(double)local_738._0_4_;
      local_730 = (double)local_6f0._0_4_;
      Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                (&local_760,&local_730);
      if ((local_760.m_row + local_760.m_currentBlockRows !=
           ((local_760.m_xpr)->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
           m_storage.m_rows) || (local_760.m_col != 1)) goto LAB_0011454d;
      std::istream::_M_extract<long_long>((longlong *)local_3b8);
      local_718 = (undefined1  [8])local_6e8;
      std::vector<MeasurementPackage,_std::allocator<MeasurementPackage>_>::push_back
                (&local_698,(value_type *)local_718);
    }
    else {
      iVar8 = std::__cxx11::string::compare((char *)local_6e0);
      if (iVar8 == 0) {
        pMStack_710 = (pointer)CONCAT44(pMStack_710._4_4_,1);
        Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
                  ((DenseStorage<double,__1,__1,_1,_0> *)&local_760,3,3,1);
        DVar1 = local_708.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                m_rows;
        pdVar2 = local_708.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                 m_data;
        pMVar4 = local_760.m_xpr;
        local_760.m_xpr =
             (Matrix<double,__1,_1,_0,__1,_1> *)
             local_708.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_data;
        local_708.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
             (double *)pMVar4;
        local_708.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
             local_760.m_row;
        local_760.m_row = DVar1;
        free(pdVar2);
        std::istream::_M_extract<float>((float *)local_3b8);
        std::istream::_M_extract<float>((float *)local_3b8);
        std::istream::_M_extract<float>((float *)local_3b8);
        local_760.m_xpr = &local_708;
        local_760.m_row = 0;
        local_760.m_col = 1;
        local_760.m_currentBlockRows = 1;
        (((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
         local_708.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data)
        ->m_storage).m_data = (double *)(double)local_6f0._0_4_;
        local_730 = (double)local_71c;
        pCVar10 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                            (&local_760,&local_730);
        local_738 = (double)local_720;
        Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                  (pCVar10,&local_738);
        if ((local_760.m_row + local_760.m_currentBlockRows !=
             ((local_760.m_xpr)->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
             m_storage.m_rows) || (local_760.m_col != 1)) goto LAB_0011454d;
        std::istream::_M_extract<long_long>((longlong *)local_3b8);
        local_718 = (undefined1  [8])local_6e8;
        std::vector<MeasurementPackage,_std::allocator<MeasurementPackage>_>::push_back
                  (&local_698,(value_type *)local_718);
      }
    }
    std::istream::_M_extract<float>((float *)local_3b8);
    std::istream::_M_extract<float>((float *)local_3b8);
    std::istream::_M_extract<float>((float *)local_3b8);
    std::istream::_M_extract<float>((float *)local_3b8);
    Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
              ((DenseStorage<double,__1,__1,_1,_0> *)&local_760,4,4,1);
    DVar1 = local_6a8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
            m_rows;
    pdVar2 = local_6a8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_data;
    pMVar4 = local_760.m_xpr;
    local_760.m_xpr =
         (Matrix<double,__1,_1,_0,__1,_1> *)
         local_6a8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
    local_6a8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         (double *)pMVar4;
    local_6a8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
         local_760.m_row;
    local_760.m_row = DVar1;
    free(pdVar2);
    local_760.m_xpr = &local_6a8;
    local_760.m_row = 0;
    local_760.m_col = 1;
    local_760.m_currentBlockRows = 1;
    (((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
     local_6a8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data)->
    m_storage).m_data = (double *)(double)local_71c;
    local_730 = (double)local_720;
    pCVar10 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                        (&local_760,&local_730);
    local_738 = (double)local_6bc;
    pCVar10 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                        (pCVar10,&local_738);
    local_6f0 = (double)local_6c0;
    Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_(pCVar10,&local_6f0);
    if ((local_760.m_row + local_760.m_currentBlockRows !=
         ((local_760.m_xpr)->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
         m_storage.m_rows) || (local_760.m_col != 1)) goto LAB_0011454d;
    std::vector<GroundTruthPackage,_std::allocator<GroundTruthPackage>_>::push_back
              (&local_678,(value_type *)local_6b8);
    std::__cxx11::istringstream::~istringstream((istringstream *)local_3b8);
    std::ios_base::~ios_base((ios_base *)(local_3b8 + 0x78));
    free(local_6a8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
    free(local_708.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
    if ((CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_6e0._0_8_ !=
        (CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)(local_6e0 + 0x10)) {
      operator_delete((void *)local_6e0._0_8_);
    }
  }
  UKF::UKF((UKF *)local_3b8);
  pMVar6 = local_698.super__Vector_base<MeasurementPackage,_std::allocator<MeasurementPackage>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  pMVar5 = local_698.super__Vector_base<MeasurementPackage,_std::allocator<MeasurementPackage>_>.
           _M_impl.super__Vector_impl_data._M_start;
  local_718 = (undefined1  [8])0x0;
  pMStack_710 = (pointer)0x0;
  local_708.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  local_6a8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  local_6b8._0_8_ = (pointer)0x0;
  local_6b8._8_8_ = (pointer)0x0;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_5b8,"px",2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_5b8,"\t",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_5b8,"py",2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_5b8,"\t",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_5b8,"v",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_5b8,"\t",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_5b8,"yaw_angle",9);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_5b8,"\t",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_5b8,"yaw_rate",8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_5b8,"\t",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_5b8,"px_measured",0xb);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_5b8,"\t",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_5b8,"py_measured",0xb);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_5b8,"\t",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_5b8,"px_true",7);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_5b8,"\t",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_5b8,"py_true",7);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_5b8,"\t",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_5b8,"vx_true",7);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_5b8,"\t",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_5b8,"vy_true",7);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_5b8,"\t",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_5b8,"NIS",3);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_5b8,"\n",1);
  if (pMVar6 != pMVar5) {
    local_640 = (long)pMVar6 - (long)pMVar5 >> 5;
    local_640 = local_640 + (ulong)(local_640 == 0);
    lVar15 = 0;
    do {
      pMVar5 = local_698.super__Vector_base<MeasurementPackage,_std::allocator<MeasurementPackage>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_660._0_8_ =
           local_698.super__Vector_base<MeasurementPackage,_std::allocator<MeasurementPackage>_>.
           _M_impl.super__Vector_impl_data._M_start[lVar15].timestamp_;
      local_660._8_4_ =
           local_698.super__Vector_base<MeasurementPackage,_std::allocator<MeasurementPackage>_>.
           _M_impl.super__Vector_impl_data._M_start[lVar15].sensor_type_;
      DVar1 = local_698.super__Vector_base<MeasurementPackage,_std::allocator<MeasurementPackage>_>.
              _M_impl.super__Vector_impl_data._M_start[lVar15].raw_measurements_.
              super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
      Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
                ((DenseStorage<double,__1,__1,_1,_0> *)(local_660 + 0x10),DVar1,DVar1,1);
      _other = &pMVar5[lVar15].raw_measurements_;
      Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
      resizeLike<Eigen::Matrix<double,_1,1,0,_1,1>>
                ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)(local_660 + 0x10),
                 (EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)_other);
      if (local_650.m_rows !=
          pMVar5[lVar15].raw_measurements_.
          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
        __assert_fail("rows() == other.rows() && cols() == other.cols()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/chrisgundling[P]Udacity-T2P2-UnscentedKalmanFilter/src/Eigen/src/Core/Assign.h"
                      ,0x1f9,
                      "Derived &Eigen::DenseBase<Eigen::Matrix<double, -1, 1>>::lazyAssign(const DenseBase<OtherDerived> &) [Derived = Eigen::Matrix<double, -1, 1>, OtherDerived = Eigen::Matrix<double, -1, 1>]"
                     );
      }
      uVar12 = local_650.m_rows - (local_650.m_rows >> 0x3f) & 0xfffffffffffffffe;
      if (1 < local_650.m_rows) {
        lVar13 = 0;
        do {
          pdVar2 = (_other->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                   m_storage.m_data + lVar13;
          dVar3 = pdVar2[1];
          local_650.m_data[lVar13] = *pdVar2;
          (local_650.m_data + lVar13)[1] = dVar3;
          lVar13 = lVar13 + 2;
        } while (lVar13 < (long)uVar12);
      }
      if ((long)uVar12 < local_650.m_rows) {
        pdVar2 = (_other->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                 m_data;
        do {
          local_650.m_data[uVar12] = pdVar2[uVar12];
          uVar12 = uVar12 + 1;
        } while (local_650.m_rows != uVar12);
      }
      UKF::ProcessMeasurement((UKF *)local_3b8,(MeasurementPackage *)local_660);
      free(local_650.m_data);
      if ((long)local_3b8._72_8_ < 1) goto LAB_0011452e;
      poVar11 = std::ostream::_M_insert<double>(*(double *)local_3b8._64_8_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\t",1);
      if ((long)local_3b8._72_8_ < 2) goto LAB_0011452e;
      poVar11 = std::ostream::_M_insert<double>(*(double *)(local_3b8._64_8_ + 8));
      std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\t",1);
      if ((long)local_3b8._72_8_ < 3) goto LAB_0011452e;
      poVar11 = std::ostream::_M_insert<double>(*(double *)(local_3b8._64_8_ + 0x10));
      std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\t",1);
      if ((long)local_3b8._72_8_ < 4) goto LAB_0011452e;
      poVar11 = std::ostream::_M_insert<double>(*(double *)(local_3b8._64_8_ + 0x18));
      std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\t",1);
      if ((long)local_3b8._72_8_ < 5) goto LAB_0011452e;
      poVar11 = std::ostream::_M_insert<double>(*(double *)(local_3b8._64_8_ + 0x20));
      std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\t",1);
      if (local_698.super__Vector_base<MeasurementPackage,_std::allocator<MeasurementPackage>_>.
          _M_impl.super__Vector_impl_data._M_start[lVar15].sensor_type_ == RADAR) {
        lVar13 = local_698.
                 super__Vector_base<MeasurementPackage,_std::allocator<MeasurementPackage>_>._M_impl
                 .super__Vector_impl_data._M_start[lVar15].raw_measurements_.
                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
        if ((lVar13 < 1) || (lVar13 == 1)) goto LAB_0011452e;
        pdVar2 = local_698.
                 super__Vector_base<MeasurementPackage,_std::allocator<MeasurementPackage>_>._M_impl
                 .super__Vector_impl_data._M_start[lVar15].raw_measurements_.
                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
        local_73c = (float)*pdVar2;
        local_724 = (float)pdVar2[1];
        fVar16 = cosf(local_724);
        poVar11 = std::ostream::_M_insert<double>((double)(fVar16 * local_73c));
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\t",1);
        fVar16 = sinf(local_724);
        poVar11 = std::ostream::_M_insert<double>((double)(fVar16 * local_73c));
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\t",1);
      }
      else if (local_698.super__Vector_base<MeasurementPackage,_std::allocator<MeasurementPackage>_>
               ._M_impl.super__Vector_impl_data._M_start[lVar15].sensor_type_ == LASER) {
        if (local_698.super__Vector_base<MeasurementPackage,_std::allocator<MeasurementPackage>_>.
            _M_impl.super__Vector_impl_data._M_start[lVar15].raw_measurements_.
            super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows < 1)
        goto LAB_0011452e;
        poVar11 = std::ostream::_M_insert<double>
                            (*local_698.
                              super__Vector_base<MeasurementPackage,_std::allocator<MeasurementPackage>_>
                              ._M_impl.super__Vector_impl_data._M_start[lVar15].raw_measurements_.
                              super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                              m_storage.m_data);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\t",1);
        if (local_698.super__Vector_base<MeasurementPackage,_std::allocator<MeasurementPackage>_>.
            _M_impl.super__Vector_impl_data._M_start[lVar15].raw_measurements_.
            super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows < 2)
        goto LAB_0011452e;
        poVar11 = std::ostream::_M_insert<double>
                            (local_698.
                             super__Vector_base<MeasurementPackage,_std::allocator<MeasurementPackage>_>
                             ._M_impl.super__Vector_impl_data._M_start[lVar15].raw_measurements_.
                             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                             m_storage.m_data[1]);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\t",1);
      }
      if (local_678.super__Vector_base<GroundTruthPackage,_std::allocator<GroundTruthPackage>_>.
          _M_impl.super__Vector_impl_data._M_start[lVar15].gt_values_.
          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows < 1)
      goto LAB_0011452e;
      poVar11 = std::ostream::_M_insert<double>
                          (*local_678.
                            super__Vector_base<GroundTruthPackage,_std::allocator<GroundTruthPackage>_>
                            ._M_impl.super__Vector_impl_data._M_start[lVar15].gt_values_.
                            super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
                            .m_data);
      std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\t",1);
      if (local_678.super__Vector_base<GroundTruthPackage,_std::allocator<GroundTruthPackage>_>.
          _M_impl.super__Vector_impl_data._M_start[lVar15].gt_values_.
          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows < 2)
      goto LAB_0011452e;
      poVar11 = std::ostream::_M_insert<double>
                          (local_678.
                           super__Vector_base<GroundTruthPackage,_std::allocator<GroundTruthPackage>_>
                           ._M_impl.super__Vector_impl_data._M_start[lVar15].gt_values_.
                           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                           m_data[1]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\t",1);
      if (local_678.super__Vector_base<GroundTruthPackage,_std::allocator<GroundTruthPackage>_>.
          _M_impl.super__Vector_impl_data._M_start[lVar15].gt_values_.
          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows < 3)
      goto LAB_0011452e;
      poVar11 = std::ostream::_M_insert<double>
                          (local_678.
                           super__Vector_base<GroundTruthPackage,_std::allocator<GroundTruthPackage>_>
                           ._M_impl.super__Vector_impl_data._M_start[lVar15].gt_values_.
                           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                           m_data[2]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\t",1);
      if (local_678.super__Vector_base<GroundTruthPackage,_std::allocator<GroundTruthPackage>_>.
          _M_impl.super__Vector_impl_data._M_start[lVar15].gt_values_.
          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows < 4)
      goto LAB_0011452e;
      poVar11 = std::ostream::_M_insert<double>
                          (local_678.
                           super__Vector_base<GroundTruthPackage,_std::allocator<GroundTruthPackage>_>
                           ._M_impl.super__Vector_impl_data._M_start[lVar15].gt_values_.
                           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                           m_data[3]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\t",1);
      if (local_698.super__Vector_base<MeasurementPackage,_std::allocator<MeasurementPackage>_>.
          _M_impl.super__Vector_impl_data._M_start[lVar15].sensor_type_ == RADAR) {
        poVar11 = std::ostream::_M_insert<double>(local_2b8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\t",1);
        pcVar14 = "R";
LAB_001140e5:
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_5b8,pcVar14,1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_5b8,"\n",1);
      }
      else if (local_698.super__Vector_base<MeasurementPackage,_std::allocator<MeasurementPackage>_>
               ._M_impl.super__Vector_impl_data._M_start[lVar15].sensor_type_ == LASER) {
        poVar11 = std::ostream::_M_insert<double>(local_2b0);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\t",1);
        pcVar14 = "L";
        goto LAB_001140e5;
      }
      Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
                ((DenseStorage<double,__1,__1,_1,_0> *)&local_760,4,4,1);
      if (((((long)local_3b8._72_8_ < 1) || (local_3b8._72_8_ == 1)) ||
          ((ulong)local_3b8._72_8_ < 3)) || (local_3b8._72_8_ == 3)) {
LAB_0011452e:
        __assert_fail("index >= 0 && index < size()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/chrisgundling[P]Udacity-T2P2-UnscentedKalmanFilter/src/Eigen/src/Core/DenseCoeffsBase.h"
                      ,0x18a,
                      "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                     );
      }
      local_724 = (float)*(double *)local_3b8._64_8_;
      local_73c = (float)*(double *)(local_3b8._64_8_ + 8);
      local_620 = *(double *)(local_3b8._64_8_ + 0x10);
      dVar3 = cos(*(double *)(local_3b8._64_8_ + 0x18));
      if (((long)local_3b8._72_8_ < 3) || (local_628 = dVar3, local_3b8._72_8_ == 3))
      goto LAB_0011452e;
      local_630 = *(double *)(local_3b8._64_8_ + 0x10);
      local_638 = sin(*(double *)(local_3b8._64_8_ + 0x18));
      local_6e0._8_8_ = 0;
      local_6e0._16_8_ = 1;
      local_6c8 = 1;
      ((local_760.m_xpr)->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
      m_data = (double *)(double)local_724;
      local_6e8 = (pointer)(double)local_73c;
      local_6e0._0_8_ = &local_760;
      pCVar10 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                          ((CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_6e0,
                           (Scalar *)&local_6e8);
      local_730 = (double)(float)(local_620 * local_628);
      pCVar10 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                          (pCVar10,&local_730);
      local_738 = (double)(float)(local_630 * local_638);
      Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                (pCVar10,&local_738);
      if ((local_6c8 + local_6e0._8_8_ != *(DenseIndex *)(local_6e0._0_8_ + 8)) ||
         (local_6e0._16_8_ != 1)) {
LAB_0011454d:
        __assert_fail("((m_row+m_currentBlockRows) == m_xpr.rows() || m_xpr.cols() == 0) && m_col == m_xpr.cols() && \"Too few coefficients passed to comma initializer (operator<<)\""
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/chrisgundling[P]Udacity-T2P2-UnscentedKalmanFilter/src/Eigen/src/Core/CommaInitializer.h"
                      ,0x6f,
                      "XprType &Eigen::CommaInitializer<Eigen::Matrix<double, -1, 1>>::finished() [MatrixType = Eigen::Matrix<double, -1, 1>]"
                     );
      }
      std::
      vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
      ::push_back((vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                   *)local_718,(value_type *)&local_760);
      std::
      vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
      ::push_back((vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                   *)local_6b8,
                  &local_678.
                   super__Vector_base<GroundTruthPackage,_std::allocator<GroundTruthPackage>_>.
                   _M_impl.super__Vector_impl_data._M_start[lVar15].gt_values_);
      free(local_760.m_xpr);
      lVar15 = lVar15 + 1;
    } while (lVar15 != local_640);
  }
  Tools::Tools((Tools *)&local_760);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Accuracy - RMSE:",0x10);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
  std::ostream::put('x');
  poVar11 = (ostream *)std::ostream::flush();
  Tools::CalculateRMSE
            ((Tools *)local_6e0,
             (vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)&local_760,
             (vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)local_718);
  poVar11 = Eigen::operator<<(poVar11,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                                      local_6e0);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
  std::ostream::put((char)poVar11);
  std::ostream::flush();
  free((void *)local_6e0._0_8_);
  cVar7 = std::__basic_file<char>::is_open();
  if (cVar7 != '\0') {
    std::ofstream::close();
  }
  cVar7 = std::__basic_file<char>::is_open();
  if (cVar7 != '\0') {
    std::ifstream::close();
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Done!",5);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
  std::ostream::put('x');
  std::ostream::flush();
  Tools::~Tools((Tools *)&local_760);
  std::
  vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
  ::~vector((vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
             *)local_6b8);
  std::
  vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
  ::~vector((vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
             *)local_718);
  UKF::~UKF((UKF *)local_3b8);
  if (local_618 != local_608) {
    operator_delete(local_618);
  }
  std::vector<GroundTruthPackage,_std::allocator<GroundTruthPackage>_>::~vector(&local_678);
  std::vector<MeasurementPackage,_std::allocator<MeasurementPackage>_>::~vector(&local_698);
  local_5b8 = _VTT;
  *(undefined8 *)(local_5b0 + *(long *)(_VTT + -0x18) + -8) = _memcpy;
  std::filebuf::~filebuf(local_5b0);
  std::ios_base::~ios_base(local_4c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5f8._M_dataplus._M_p != &local_5f8.field_2) {
    operator_delete(local_5f8._M_dataplus._M_p);
  }
  std::ifstream::~ifstream(local_238);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5d8._M_dataplus._M_p != &local_5d8.field_2) {
    operator_delete(local_5d8._M_dataplus._M_p);
  }
  return 0;
}

Assistant:

int main(int argc, char* argv[]) {

  check_arguments(argc, argv);

  string in_file_name_ = argv[1];
  ifstream in_file_(in_file_name_.c_str(), ifstream::in);

  string out_file_name_ = argv[2];
  ofstream out_file_(out_file_name_.c_str(), ofstream::out);

  check_files(in_file_, in_file_name_, out_file_, out_file_name_);

  /**********************************************
   *  Set Measurements                          *
   **********************************************/

  vector<MeasurementPackage> measurement_pack_list;
  vector<GroundTruthPackage> gt_pack_list;

  string line;

  // prep the measurement packages (each line represents a measurement at a
  // timestamp)
  while (getline(in_file_, line)) {
    string sensor_type;
    MeasurementPackage meas_package;
    GroundTruthPackage gt_package;
    istringstream iss(line);
    long long timestamp;

    // reads first element from the current line
    iss >> sensor_type;

    if (sensor_type.compare("L") == 0) {
      // laser measurement

      // read measurements at this timestamp
      meas_package.sensor_type_ = MeasurementPackage::LASER;
      meas_package.raw_measurements_ = VectorXd(2);
      float px;
      float py;
      iss >> px;
      iss >> py;
      meas_package.raw_measurements_ << px, py;
      iss >> timestamp;
      meas_package.timestamp_ = timestamp;
      measurement_pack_list.push_back(meas_package);
    } else if (sensor_type.compare("R") == 0) {
      // radar measurement

      // read measurements at this timestamp
      meas_package.sensor_type_ = MeasurementPackage::RADAR;
      meas_package.raw_measurements_ = VectorXd(3);
      float ro;
      float phi;
      float ro_dot;
      iss >> ro;
      iss >> phi;
      iss >> ro_dot;
      meas_package.raw_measurements_ << ro, phi, ro_dot;
      iss >> timestamp;
      meas_package.timestamp_ = timestamp;
      measurement_pack_list.push_back(meas_package);
    }

      // read ground truth data to compare later
      float x_gt;
      float y_gt;
      float vx_gt;
      float vy_gt;
      iss >> x_gt;
      iss >> y_gt;
      iss >> vx_gt;
      iss >> vy_gt;
      gt_package.gt_values_ = VectorXd(4);
      gt_package.gt_values_ << x_gt, y_gt, vx_gt, vy_gt;
      gt_pack_list.push_back(gt_package);
  }

  // Create a UKF instance
  UKF ukf;

  // used to compute the RMSE later
  vector<VectorXd> estimations;
  vector<VectorXd> ground_truth;

  // start filtering from the second frame (the speed is unknown in the first
  // frame)

  size_t number_of_measurements = measurement_pack_list.size();

  // column names for output file
  out_file_ << "px" << "\t";
  out_file_ << "py" << "\t";
  out_file_ << "v" << "\t";
  out_file_ << "yaw_angle" << "\t";
  out_file_ << "yaw_rate" << "\t";
  out_file_ << "px_measured" << "\t";
  out_file_ << "py_measured" << "\t";
  out_file_ << "px_true" << "\t";
  out_file_ << "py_true" << "\t";
  out_file_ << "vx_true" << "\t";
  out_file_ << "vy_true" << "\t";
  out_file_ << "NIS" << "\n";


  for (size_t k = 0; k < number_of_measurements; ++k) {
    // Call the UKF-based fusion
    ukf.ProcessMeasurement(measurement_pack_list[k]);

    // output the estimation
    out_file_ << ukf.x_(0) << "\t"; // pos1 - est
    out_file_ << ukf.x_(1) << "\t"; // pos2 - est
    out_file_ << ukf.x_(2) << "\t"; // vel_abs -est
    out_file_ << ukf.x_(3) << "\t"; // yaw_angle -est
    out_file_ << ukf.x_(4) << "\t"; // yaw_rate -est

    // output the measurements
    if (measurement_pack_list[k].sensor_type_ == MeasurementPackage::LASER) {
      // output the estimation

      // p1 - meas
      out_file_ << measurement_pack_list[k].raw_measurements_(0) << "\t";

      // p2 - meas
      out_file_ << measurement_pack_list[k].raw_measurements_(1) << "\t";
    } else if (measurement_pack_list[k].sensor_type_ == MeasurementPackage::RADAR) {
      // output the estimation in the cartesian coordinates
      float ro = measurement_pack_list[k].raw_measurements_(0);
      float phi = measurement_pack_list[k].raw_measurements_(1);
      out_file_ << ro * cos(phi) << "\t"; // p1_meas
      out_file_ << ro * sin(phi) << "\t"; // p2_meas
    }

    // output the ground truth packages
    out_file_ << gt_pack_list[k].gt_values_(0) << "\t";
    out_file_ << gt_pack_list[k].gt_values_(1) << "\t";
    out_file_ << gt_pack_list[k].gt_values_(2) << "\t";
    out_file_ << gt_pack_list[k].gt_values_(3) << "\t";

    // output the NIS values
    
    if (measurement_pack_list[k].sensor_type_ == MeasurementPackage::LASER) {
      out_file_ << ukf.NIS_laser_ << "\t";
      out_file_ << "L" << "\n";
    } else if (measurement_pack_list[k].sensor_type_ == MeasurementPackage::RADAR) {
      out_file_ << ukf.NIS_radar_ << "\t";
      out_file_ << "R" << "\n";
    }


    // convert ukf x vector to cartesian to compare to ground truth
    VectorXd ukf_x_cartesian_ = VectorXd(4);

    float x_estimate_ = ukf.x_(0);
    float y_estimate_ = ukf.x_(1);
    float vx_estimate_ = ukf.x_(2) * cos(ukf.x_(3));
    float vy_estimate_ = ukf.x_(2) * sin(ukf.x_(3));
    
    ukf_x_cartesian_ << x_estimate_, y_estimate_, vx_estimate_, vy_estimate_;
    
    estimations.push_back(ukf_x_cartesian_);
    ground_truth.push_back(gt_pack_list[k].gt_values_);

  }

  // compute the accuracy (RMSE)
  Tools tools;
  cout << "Accuracy - RMSE:" << endl << tools.CalculateRMSE(estimations, ground_truth) << endl;

  // close files
  if (out_file_.is_open()) {
    out_file_.close();
  }

  if (in_file_.is_open()) {
    in_file_.close();
  }

  cout << "Done!" << endl;
  return 0;
}